

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_abs<double>(uint length)

{
  element_type eVar1;
  double dVar2;
  element_type eVar3;
  element_type eVar4;
  element_type eVar5;
  int iVar6;
  double *__p;
  element_type *peVar7;
  undefined8 *puVar8;
  double dVar9;
  int local_310;
  int i_1;
  int local_2fc;
  int i;
  double *v;
  shared_ptr<double> pv;
  uint length_local;
  __m128d a0_2;
  __m128d a0_1;
  __m128d a1;
  __m128d a0;
  uint local_27c;
  element_type *local_278;
  element_type *local_270;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  uint local_28;
  uint uStack_24;
  uint local_18;
  uint uStack_14;
  
  pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = length;
  __p = sse::common::malloc<double>(length);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)&v,__p,sse::common::free<double>);
  peVar7 = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)&v);
  for (local_2fc = 0;
      local_2fc <
      (int)(uint)pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_2fc = local_2fc + 1) {
    peVar7[local_2fc] = (double)-local_2fc;
  }
  pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (uint)pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_278 = peVar7;
  local_270 = peVar7;
  for (local_27c = (uint)pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ; 3 < (int)local_27c; local_27c = local_27c - 4) {
    eVar1 = *local_270;
    eVar3 = local_270[1];
    eVar4 = local_270[2];
    eVar5 = local_270[3];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_78 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_74 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_70 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_6c = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_88 = SUB84(eVar1,0);
    uStack_84 = (uint)((ulong)eVar1 >> 0x20);
    uStack_80 = SUB84(eVar3,0);
    uStack_7c = (uint)((ulong)eVar3 >> 0x20);
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_58 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_54 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_50 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_4c = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_68 = SUB84(eVar4,0);
    uStack_64 = (uint)((ulong)eVar4 >> 0x20);
    uStack_60 = SUB84(eVar5,0);
    uStack_5c = (uint)((ulong)eVar5 >> 0x20);
    *local_278 = (element_type)
                 CONCAT44((uStack_74 ^ 0xffffffff) & uStack_84,(local_78 ^ 0xffffffff) & local_88);
    local_278[1] = (element_type)
                   CONCAT44((uStack_6c ^ 0xffffffff) & uStack_7c,
                            (uStack_70 ^ 0xffffffff) & uStack_80);
    local_278[2] = (element_type)
                   CONCAT44((uStack_54 ^ 0xffffffff) & uStack_64,(local_58 ^ 0xffffffff) & local_68)
    ;
    local_278[3] = (element_type)
                   CONCAT44((uStack_4c ^ 0xffffffff) & uStack_5c,
                            (uStack_50 ^ 0xffffffff) & uStack_60);
    local_270 = local_270 + 4;
    local_278 = local_278 + 4;
  }
  if (1 < (int)local_27c) {
    eVar1 = *local_270;
    eVar3 = local_270[1];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_38 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_34 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_30 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_2c = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_48 = SUB84(eVar1,0);
    uStack_44 = (uint)((ulong)eVar1 >> 0x20);
    uStack_40 = SUB84(eVar3,0);
    uStack_3c = (uint)((ulong)eVar3 >> 0x20);
    *local_278 = (element_type)
                 CONCAT44((uStack_34 ^ 0xffffffff) & uStack_44,(local_38 ^ 0xffffffff) & local_48);
    local_278[1] = (element_type)
                   CONCAT44((uStack_2c ^ 0xffffffff) & uStack_3c,
                            (uStack_30 ^ 0xffffffff) & uStack_40);
    local_27c = local_27c - 2;
    local_270 = local_270 + 2;
    local_278 = local_278 + 2;
  }
  if (local_27c != 0) {
    eVar1 = *local_270;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_18 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_14 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    local_28 = SUB84(eVar1,0);
    uStack_24 = (uint)((ulong)eVar1 >> 0x20);
    *local_278 = (element_type)
                 CONCAT44((uStack_14 ^ 0xffffffff) & uStack_24,(local_18 ^ 0xffffffff) & local_28);
  }
  local_310 = 0;
  do {
    if ((int)(uint)pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <=
        local_310) {
      std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)&v);
      return;
    }
    if (peVar7[local_310] <= 0.0 && peVar7[local_310] != 0.0) {
      dVar2 = peVar7[local_310];
      dVar9 = std::numeric_limits<double>::min();
      if ((dVar2 != dVar9) || (NAN(dVar2) || NAN(dVar9))) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar8 = "void test_abs(unsigned int) [T = double]";
        *(undefined4 *)(puVar8 + 1) = 0x81;
        *(uint *)((long)puVar8 + 0xc) =
             (uint)pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        __cxa_throw(puVar8,&Exception::typeinfo,0);
      }
    }
    local_310 = local_310 + 1;
  } while( true );
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}